

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O3

pair<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node_*,_long>
 __thiscall
sjtu::
DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
::newspace(DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
           *this)

{
  fstream *pfVar1;
  undefined1 *puVar2;
  long lVar3;
  _Ios_Seekdir _Var4;
  pair<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node_*,_long>
  pVar5;
  locType offset_;
  locType offset;
  node tmp;
  long local_998;
  long local_990;
  undefined4 local_988 [202];
  undefined8 uStack_660;
  undefined4 auStack_658 [396];
  
  lVar3 = 0x330;
  do {
    *(undefined8 *)((long)local_988 + lVar3 + -8) = 0;
    *(undefined4 *)((long)local_988 + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x960);
  memset(local_988,0,0x960);
  pfVar1 = &(this->
            super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
            ).file;
  std::istream::seekg((long)pfVar1,_S_beg);
  std::istream::read((char *)pfVar1,(long)&local_990);
  puVar2 = &(this->
            super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
            ).field_0x18;
  std::ostream::seekp((long)puVar2,_S_beg);
  std::ios::clear((int)*(undefined8 *)
                        (*(long *)&(this->
                                   super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                                   ).file + -0x18) + (int)pfVar1);
  lVar3 = std::ostream::tellp();
  if (lVar3 == local_990) {
    std::ostream::write(puVar2,(long)local_988);
    local_998 = local_990 + 0x960;
    std::ostream::seekp((long)puVar2,_S_beg);
    std::ostream::write(puVar2,(long)local_988);
    _Var4 = 0xfffff6a0;
  }
  else {
    std::istream::seekg(pfVar1,local_990,0);
    std::istream::read((char *)pfVar1,(long)&local_998);
    _Var4 = _S_beg;
  }
  std::ostream::seekp((long)puVar2,_Var4);
  std::ostream::write(puVar2,(long)&local_998);
  pVar5.first = LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                ::load((this->
                       super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                       ).cache,&local_990);
  pVar5.second = local_990;
  return pVar5;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			locType offset , offset_;T tmp;
			file.seekg(0 , std::ios_base::beg) , file.read(reinterpret_cast<char *> (&offset) , sizeof (locType));
			file.seekp(0 , std::ios_base::end) , file.clear();
			if (file.tellp() == offset)
			{
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				offset_ = offset + sizeof (T) , file.seekp(0 , std::ios_base::beg);
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(- sizeof (T) , std::ios_base::cur) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			else
			{
				file.seekg(offset) , file.read(reinterpret_cast<char *> (&offset_) , sizeof (locType));
				//file.seekp(offset) , file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(0 , std::ios_base::beg) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			return std::make_pair(cache -> load(offset) , offset);
		}